

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlPopPE(xmlParserCtxtPtr ctxt)

{
  xmlEntityPtr pxVar1;
  xmlParserInputPtr *ppxVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  xmlParserInputPtr pxVar8;
  
  pxVar1 = ctxt->input->entity;
  uVar4 = pxVar1->flags;
  pxVar1->flags = uVar4 & 0xfffffff7;
  if ((uVar4 & 2) == 0) {
    do {
      ctxt->input->cur = ctxt->input->end;
      xmlParserShrink(ctxt);
      iVar3 = xmlParserGrow(ctxt);
    } while (0 < iVar3);
    pxVar8 = ctxt->input;
    uVar5 = (long)pxVar8->end - (long)pxVar8->base;
    uVar6 = uVar5 + pxVar8->consumed;
    if (CARRY8(uVar5,pxVar8->consumed)) {
      uVar6 = 0xffffffffffffffff;
    }
    uVar7 = pxVar1->expandedSize + uVar6;
    if (CARRY8(pxVar1->expandedSize,uVar6)) {
      uVar7 = 0xffffffffffffffff;
    }
    pxVar1->expandedSize = uVar7;
    if (pxVar1->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
      uVar7 = uVar6 + ctxt->sizeentities;
      if (CARRY8(uVar6,ctxt->sizeentities)) {
        uVar7 = 0xffffffffffffffff;
      }
      ctxt->sizeentities = uVar7;
    }
    *(byte *)&pxVar1->flags = (byte)pxVar1->flags | 2;
  }
  iVar3 = ctxt->inputNr;
  if ((long)iVar3 < 1) {
    pxVar8 = (xmlParserInputPtr)0x0;
  }
  else {
    uVar4 = iVar3 - 1;
    ctxt->inputNr = uVar4;
    ppxVar2 = ctxt->inputTab;
    if (iVar3 == 1) {
      pxVar8 = (xmlParserInputPtr)0x0;
    }
    else {
      pxVar8 = ppxVar2[(long)iVar3 + -2];
    }
    ctxt->input = pxVar8;
    pxVar8 = ppxVar2[uVar4];
    ppxVar2[uVar4] = (xmlParserInputPtr)0x0;
  }
  xmlFreeInputStream(pxVar8);
  xmlParserEntityCheck(ctxt,pxVar1->expandedSize);
  pxVar8 = ctxt->input;
  if (((pxVar8->flags & 0x40) == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    return;
  }
  return;
}

Assistant:

static void
xmlPopPE(xmlParserCtxtPtr ctxt) {
    unsigned long consumed;
    xmlEntityPtr ent;

    ent = ctxt->input->entity;

    ent->flags &= ~XML_ENT_EXPANDING;

    if ((ent->flags & XML_ENT_CHECKED) == 0) {
        int result;

        /*
         * Read the rest of the stream in case of errors. We want
         * to account for the whole entity size.
         */
        do {
            ctxt->input->cur = ctxt->input->end;
            xmlParserShrink(ctxt);
            result = xmlParserGrow(ctxt);
        } while (result > 0);

        consumed = ctxt->input->consumed;
        xmlSaturatedAddSizeT(&consumed,
                             ctxt->input->end - ctxt->input->base);

        xmlSaturatedAdd(&ent->expandedSize, consumed);

        /*
         * Add to sizeentities when parsing an external entity
         * for the first time.
         */
        if (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
            xmlSaturatedAdd(&ctxt->sizeentities, consumed);
        }

        ent->flags |= XML_ENT_CHECKED;
    }

    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    xmlParserEntityCheck(ctxt, ent->expandedSize);

    GROW;
}